

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

wchar_t count_chests(loc *grid,chest_query check_type)

{
  loc grid_00;
  object *poVar1;
  wchar_t wVar2;
  long lVar3;
  
  lVar3 = 0;
  wVar2 = L'\0';
  do {
    grid_00 = (loc)loc_sum(player->grid,(loc_conflict)ddgrid_ddd[lVar3]);
    poVar1 = chest_check(player,grid_00,check_type);
    if (poVar1 != (object *)0x0) {
      wVar2 = wVar2 + L'\x01';
      *grid = grid_00;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  return wVar2;
}

Assistant:

int count_chests(struct loc *grid, enum chest_query check_type)
{
	int d, count;

	/* Count how many matches */
	count = 0;

	/* Check around (and under) the character */
	for (d = 0; d < 9; d++) {
		/* Extract adjacent (legal) location */
		struct loc grid1 = loc_sum(player->grid, ddgrid_ddd[d]);

		/* No (visible) chest is there */
		if (!chest_check(player, grid1, check_type)) continue;

		/* Count it */
		++count;

		/* Remember the location of the last chest found */
		*grid = grid1;
	}

	/* All done */
	return count;
}